

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_serve_http(mg_connection *nc,http_message *hm,mg_serve_http_opts opts)

{
  byte bVar1;
  http_message *phVar2;
  mg_connection *conn;
  char *pattern;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  byte *pbVar8;
  ulong uVar9;
  size_t __n;
  long lVar10;
  undefined1 *puVar11;
  byte *dst;
  char path [4096];
  undefined1 auStack_2088 [8];
  http_message *local_2080;
  mg_str *local_2078;
  mg_str local_2070;
  mg_connection *local_2060;
  mg_str local_2058;
  char *local_2048;
  socklen_t local_203c;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined4 local_2028;
  sockaddr local_1038 [256];
  
  pcVar6 = opts.url_rewrites;
  puVar11 = auStack_2088;
  local_2038 = 0x25;
  uStack_2030 = 0;
  local_2028 = 0;
  local_203c = 8;
  local_1038[0].sa_family = 0;
  local_1038[0].sa_data[0] = '\0';
  local_1038[0].sa_data[1] = '\0';
  local_1038[0].sa_data[2] = '\0';
  local_1038[0].sa_data[3] = '\0';
  local_1038[0].sa_data[4] = '\0';
  local_1038[0].sa_data[5] = '\0';
  local_1038[0].sa_data[6] = '\0';
  local_1038[0].sa_data[7] = '\0';
  local_1038[0].sa_data[8] = '\0';
  local_1038[0].sa_data[9] = '\0';
  local_1038[0].sa_data[10] = '\0';
  local_1038[0].sa_data[0xb] = '\0';
  local_1038[0].sa_data[0xc] = '\0';
  local_1038[0].sa_data[0xd] = '\0';
  local_2080 = hm;
  local_2060 = nc;
  getsockname(nc->sock,local_1038,&local_203c);
  local_2038._0_2_ = (ushort)(byte)local_2038;
  snprintf((char *)((long)&local_2038 + 1),0x13,"%d",
           (ulong)(ushort)(local_1038[0].sa_data._0_2_ << 8 |
                          (ushort)local_1038[0].sa_data._0_2_ >> 8));
  dst = (byte *)&local_2038;
  local_2048 = pcVar6;
  while (pcVar6 = mg_next_comma_list_entry(pcVar6,&local_2058,&local_2070), phVar2 = local_2080,
        pcVar6 != (char *)0x0) {
    sVar7 = strlen((char *)dst);
    sVar3 = local_2058.len;
    __n = local_2058.len;
    if (sVar7 <= local_2058.len) {
      __n = sVar7;
    }
    iVar4 = bcmp(local_2058.p,dst,__n);
    conn = local_2060;
    if ((int)sVar3 == (int)sVar7 && iVar4 == 0) {
      mg_printf(local_2060,"HTTP/1.1 %d %s\r\n",0x12d,"Moved");
      mg_printf(conn,"Content-Length: 0\r\nLocation: %.*s%.*s\r\n\r\n",(ulong)(uint)local_2070.len,
                local_2070.p,(ulong)(~(uint)(local_2080->uri).p + *(int *)&(local_2080->proto).p));
      return;
    }
  }
  if (opts.document_root == (char *)0x0) {
    opts.document_root = ".";
  }
  pcVar6 = opts.document_root;
  if (opts.per_directory_auth_file == (char *)0x0) {
    opts.per_directory_auth_file = ".htpasswd";
  }
  if (opts.enable_directory_listing == (char *)0x0) {
    opts.enable_directory_listing = "yes";
  }
  if (opts.cgi_file_pattern == (char *)0x0) {
    opts.cgi_file_pattern = "**.cgi$|**.php$";
  }
  if (opts.ssi_pattern == (char *)0x0) {
    opts.ssi_pattern = "**.shtml$|**.shtm$";
  }
  if (opts.index_files == (char *)0x0) {
    opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
  }
  local_2078 = mg_get_http_header(local_2080,"Host");
  mg_url_decode((phVar2->uri).p,(int)(phVar2->uri).len,(char *)dst,0x1000,0);
  uVar9 = local_2038 & 0xff;
  if ((byte)local_2038 != 0) {
    pbVar8 = (byte *)&local_2038;
    dst = pbVar8;
LAB_0010feb5:
    *dst = (byte)uVar9;
    bVar1 = *pbVar8;
    pbVar8 = pbVar8 + 1;
    if ((bVar1 == 0x5c) || (bVar1 == 0x2f)) {
      do {
        bVar1 = *pbVar8;
        uVar9 = (ulong)bVar1;
        lVar10 = 1;
        if ((bVar1 != 0x5c) && (bVar1 != 0x2f)) {
          if (bVar1 != 0x2e) goto LAB_0010fef5;
          lVar10 = 2;
          if (pbVar8[1] != 0x2e) goto LAB_0010fef3;
        }
        pbVar8 = pbVar8 + lVar10;
      } while( true );
    }
    uVar9 = (ulong)*pbVar8;
    goto LAB_0010fef5;
  }
LAB_0010fefc:
  *dst = 0;
  snprintf((char *)local_1038,0x1000,"%s%s",pcVar6,&local_2038);
  iVar4 = is_dav_request((mg_str *)(phVar2->method).p);
  if ((iVar4 != 0) && (opts.dav_document_root != (char *)0x0)) {
    snprintf((char *)local_1038,0x1000,"%s%s",opts.dav_document_root,&local_2038);
  }
  pcVar6 = local_2048;
  do {
    pcVar6 = mg_next_comma_list_entry(pcVar6,&local_2058,&local_2070);
    sVar3 = local_2058.len;
    pattern = local_2058.p;
    if (pcVar6 == (char *)0x0) goto LAB_0011001d;
    if ((((1 < local_2058.len) && (*local_2058.p == '@' && local_2078 != (mg_str *)0x0)) &&
        (local_2078->len == local_2058.len - 1)) &&
       (iVar4 = mg_ncasecmp(local_2058.p + 1,local_2078->p,local_2078->len), iVar4 == 0))
    goto LAB_00110011;
    uVar5 = mg_match_prefix(pattern,(int)sVar3,(char *)&local_2038);
  } while ((int)uVar5 < 1);
  puVar11 = auStack_2088 + uVar5;
LAB_00110011:
  snprintf((char *)local_1038,0x1000,"%.*s%s",(ulong)(uint)local_2070.len,local_2070.p,
           puVar11 + 0x50);
LAB_0011001d:
  phVar2 = local_2080;
  mg_send_http_file(local_2060,(char *)local_1038,0x1000,local_2080,&opts);
  uVar9 = (phVar2->proto).len;
  sVar7 = 8;
  if (uVar9 < 8) {
    sVar7 = uVar9;
  }
  iVar4 = bcmp((phVar2->proto).p,"HTTP/1.1",sVar7);
  if ((int)uVar9 == 8 && iVar4 == 0) {
    mg_get_http_header(phVar2,"Connection");
  }
  return;
LAB_0010fef3:
  uVar9 = 0x2e;
LAB_0010fef5:
  dst = dst + 1;
  if ((char)uVar9 == '\0') goto LAB_0010fefc;
  goto LAB_0010feb5;
}

Assistant:

void mg_serve_http(struct mg_connection *nc, struct http_message *hm,
                   struct mg_serve_http_opts opts) {
    char path[MG_MAX_PATH];
    struct mg_str *hdr;

    if (send_port_based_redirect(nc, hm, &opts)) {
        return;
    }

    if (opts.document_root == NULL) {
        opts.document_root = ".";
    }
    if (opts.per_directory_auth_file == NULL) {
        opts.per_directory_auth_file = ".htpasswd";
    }
    if (opts.enable_directory_listing == NULL) {
        opts.enable_directory_listing = "yes";
    }
    if (opts.cgi_file_pattern == NULL) {
        opts.cgi_file_pattern = "**.cgi$|**.php$";
    }
    if (opts.ssi_pattern == NULL) {
        opts.ssi_pattern = "**.shtml$|**.shtm$";
    }
    if (opts.index_files == NULL) {
        opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
    }

    uri_to_path(hm, path, sizeof(path), &opts);
    mg_send_http_file(nc, path, sizeof(path), hm, &opts);

    /* Close connection for non-keep-alive requests */
    if (mg_vcmp(&hm->proto, "HTTP/1.1") != 0 ||
        ((hdr = mg_get_http_header(hm, "Connection")) != NULL &&
         mg_vcmp(hdr, "keep-alive") != 0)) {
#if 0
        nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
    }
}